

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizer-a3.cpp
# Opt level: O1

void __thiscall
RasterizerA3<8u>::_renderImpl<CompositorScalar,false>(RasterizerA3<8u> *this,uint32_t argb32)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  long lVar19;
  uint uVar20;
  long lVar21;
  ulong *local_80;
  ulong local_78;
  
  uVar16 = (ulong)(int)*(uint *)(this + 0x40);
  uVar1 = *(uint *)(this + 0x44);
  if (*(uint *)(this + 0x40) <= uVar1) {
    lVar2 = *(long *)(*(long *)(this + 8) + 8);
    iVar12 = (argb32 & 0xff00ff) * (argb32 >> 0x18);
    iVar5 = (argb32 >> 8 & 0xff | 0xff0000) * (argb32 >> 0x18);
    uVar14 = (iVar5 + 0x800080U >> 8 & 0xff00ff) + iVar5 + 0x800080;
    uVar11 = (iVar12 + 0x800080U >> 8 & 0xff00ff) + iVar12 + 0x800080 >> 8 & 0xff00ff;
    lVar21 = lVar2 * uVar16 + *(long *)(*(long *)(this + 8) + 0x10);
    lVar19 = *(long *)(this + 0x58) * uVar16 * 8 + *(long *)(this + 0x60);
    local_80 = (ulong *)(*(long *)(this + 0x48) * uVar16 * 8 + *(long *)(this + 0x50));
    uVar20 = uVar14 & 0xff00ff00 | uVar11;
    uVar14 = uVar14 >> 8 & 0xff00ff;
    do {
      lVar10 = *(long *)(this + 0x48);
      uVar15 = 0;
      uVar4 = 0;
      local_78 = 0;
      do {
        uVar7 = *local_80;
        *local_80 = 0;
        if (uVar7 != 0) {
          do {
            lVar3 = 0;
            if (uVar7 != 0) {
              for (; (uVar7 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
              }
            }
            uVar17 = -1L << ((byte)lVar3 & 0x3f);
            uVar8 = (uint)((int)lVar3 << 3) | local_78;
            uVar9 = uVar4;
            if (uVar4 < uVar8) {
              uVar18 = uVar15 & 0x1ff;
              uVar6 = uVar18 ^ 0x1ff;
              if (uVar18 < 0x100) {
                uVar6 = uVar18;
              }
              uVar9 = uVar8;
              if (uVar6 != 0) {
                if (uVar6 == 0xff) {
                  do {
                    *(uint *)(lVar21 + uVar4 * 4) = uVar20;
                    uVar4 = uVar4 + 1;
                  } while (uVar4 < uVar8);
                }
                else {
                  do {
                    uVar18 = *(uint *)(lVar21 + uVar4 * 4);
                    uVar13 = (uVar18 & 0xff00ff) * (0xff - uVar6) + uVar6 * uVar11 + 0x800080;
                    uVar18 = (uVar18 >> 8 & 0xff00ff) * (0xff - uVar6) + uVar6 * uVar14 + 0x800080;
                    *(uint *)(lVar21 + uVar4 * 4) =
                         (uVar13 >> 8 & 0xff00ff) + uVar13 >> 8 & 0xff00ff |
                         (uVar18 >> 8 & 0xff00ff) + uVar18 & 0xff00ff00;
                    uVar4 = uVar4 + 1;
                  } while (uVar4 < uVar8);
                }
              }
            }
            uVar8 = uVar17 ^ uVar7;
            if (uVar7 == uVar17) {
              uVar4 = (long)*(int *)(this + 0x30);
              uVar7 = uVar8;
              if (local_78 + 0x200 < (ulong)(long)*(int *)(this + 0x30)) {
                uVar4 = local_78 + 0x200;
              }
            }
            else {
              lVar3 = 0;
              if (uVar8 != 0) {
                for (; (uVar8 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
                }
              }
              uVar4 = (uint)((int)lVar3 << 3) | local_78;
              uVar7 = -1L << ((byte)lVar3 & 0x3f) ^ uVar8;
            }
            if (uVar9 < uVar4) {
              do {
                uVar15 = uVar15 + *(int *)(lVar19 + uVar9 * 8);
                uVar18 = uVar15 - (*(uint *)(lVar19 + 4 + uVar9 * 8) >> 9) & 0x1ff;
                uVar6 = uVar18 ^ 0x1ff;
                if (uVar18 < 0x100) {
                  uVar6 = uVar18;
                }
                *(undefined8 *)(lVar19 + uVar9 * 8) = 0;
                uVar18 = uVar20;
                if (uVar6 != 0xff) {
                  uVar18 = *(uint *)(lVar21 + uVar9 * 4);
                  iVar12 = uVar6 * uVar11 + (uVar18 & 0xff00ff) * (0xff - uVar6);
                  iVar5 = uVar6 * uVar14 + (0xff - uVar6) * (uVar18 >> 8 & 0xff00ff);
                  uVar18 = (iVar12 + 0x800080U >> 8 & 0xff00ff) + iVar12 + 0x800080 >> 8 & 0xff00ff
                           | iVar5 + (iVar5 + 0x800080U >> 8 & 0xff00ff) + 0x800080 & 0xff00ff00;
                }
                *(uint *)(lVar21 + uVar9 * 4) = uVar18;
                uVar9 = uVar9 + 1;
              } while (uVar4 != uVar9);
            }
          } while (uVar7 != 0);
        }
        local_78 = local_78 + 0x200;
        local_80 = local_80 + 1;
        lVar10 = lVar10 + -1;
      } while (lVar10 != 0);
      uVar7 = (ulong)*(int *)(this + 0x30);
      if (uVar4 < uVar7) {
        uVar15 = uVar15 & 0x1ff;
        uVar6 = uVar15 ^ 0x1ff;
        if (uVar15 < 0x100) {
          uVar6 = uVar15;
        }
        if (uVar6 != 0) {
          if (uVar6 == 0xff) {
            if (uVar4 < uVar7) {
              do {
                *(uint *)(lVar21 + uVar4 * 4) = uVar20;
                uVar4 = uVar4 + 1;
              } while (uVar7 != uVar4);
            }
          }
          else if (uVar4 < uVar7) {
            do {
              uVar15 = *(uint *)(lVar21 + uVar4 * 4);
              uVar18 = (uVar15 & 0xff00ff) * (0xff - uVar6) + uVar6 * uVar11 + 0x800080;
              uVar15 = (uVar15 >> 8 & 0xff00ff) * (0xff - uVar6) + uVar6 * uVar14 + 0x800080;
              *(uint *)(lVar21 + uVar4 * 4) =
                   (uVar18 >> 8 & 0xff00ff) + uVar18 >> 8 & 0xff00ff |
                   (uVar15 >> 8 & 0xff00ff) + uVar15 & 0xff00ff00;
              uVar4 = uVar4 + 1;
            } while (uVar7 != uVar4);
          }
        }
      }
      lVar21 = lVar21 + lVar2;
      lVar19 = lVar19 + *(long *)(this + 0x58) * 8;
      uVar16 = uVar16 + 1;
    } while (uVar16 <= (ulong)(long)(int)uVar1);
  }
  *(undefined8 *)(this + 0x40) = 0x7fffffff;
  return;
}

Assistant:

inline void RasterizerA3<N>::_renderImpl(uint32_t argb32) noexcept {
  uint8_t* dstLine = _dst->data();
  intptr_t dstStride = _dst->stride();

  size_t y0 = size_t(_yBounds.start);
  size_t y1 = size_t(_yBounds.end);

  BitWord* bitPtr = _bits + y0 * _bitStride;
  Cell* cellLine = _cells + y0 * _cellStride;

  Compositor compositor(argb32);
  dstLine += y0 * dstStride;

  while (y0 <= y1) {
    size_t nBits = size_t(_bitStride);

    Cell* cell = cellLine;
    uint32_t* dstPix = reinterpret_cast<uint32_t*>(dstLine);

    int cover = 0;
    size_t x0 = 0;
    size_t xOffset = 0;

    do {
      IntUtils::BitWordFlipIterator<BitWord> it(*bitPtr);
      *bitPtr = 0;

      while (it.hasNext()) {
        size_t x1 = xOffset + it.nextAndFlip() * kPixelsPerOneBit;
        if (x0 < x1) {
          uint32_t mask = CompositeUtils::calcMask<NonZero>(cover);
          if (mask)
            compositor.cmask(dstPix, x0, x1, mask);
          x0 = x1;
        }

        if (it.hasNext())
          x1 = xOffset + it.nextAndFlip() * kPixelsPerOneBit;
        else
          x1 = std::min<size_t>(_width, xOffset + kPixelsPerBitWord);

        compositor.template vmask<NonZero>(dstPix, x0, x1, cell, cover);
        x0 = x1;
      }

      xOffset += kPixelsPerBitWord;
      bitPtr++;
    } while (--nBits);

    if (x0 < _width) {
      uint32_t mask = CompositeUtils::calcMask<NonZero>(cover);
      if (mask)
        compositor.cmask(dstPix, x0, _width, mask);
    }

    dstLine += dstStride;
    cellLine += _cellStride;
    y0++;
  }

  _yBounds.reset();
}